

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

void fe_spec2cep(fe_t *fe,powspec_t *mflogspec,mfcc_t *mfcep)

{
  byte bVar1;
  uint uVar2;
  melfb_t *pmVar3;
  mfcc_t *pmVar4;
  float fVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  mfcc_t mVar9;
  
  *mfcep = (mfcc_t)(float)((double)*mflogspec * 0.5);
  pmVar3 = fe->mel_fb;
  uVar2 = pmVar3->num_filters;
  if (1 < (long)(int)uVar2) {
    mVar9 = *mfcep;
    lVar7 = 1;
    do {
      mVar9 = (mfcc_t)(float)((double)(float)mVar9 + (double)mflogspec[lVar7]);
      lVar7 = lVar7 + 1;
    } while ((int)uVar2 != lVar7);
    *mfcep = mVar9;
  }
  fVar5 = (float)(int)uVar2;
  *mfcep = (mfcc_t)((float)*mfcep / fVar5);
  bVar1 = fe->num_cepstra;
  if (1 < (ulong)bVar1) {
    uVar8 = 1;
    do {
      mfcep[uVar8] = 0.0;
      if (0 < (int)uVar2) {
        pmVar4 = pmVar3->mel_cosine[uVar8];
        mVar9 = mfcep[uVar8];
        uVar6 = 0;
        do {
          mVar9 = (mfcc_t)(float)((double)(float)pmVar4[uVar6] * (double)mflogspec[uVar6] *
                                  *(double *)(&DAT_0015a180 + (ulong)(uVar6 == 0) * 8) +
                                 (double)(float)mVar9);
          mfcep[uVar8] = mVar9;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      mfcep[uVar8] = (mfcc_t)((float)mfcep[uVar8] / (fVar5 + fVar5));
      uVar8 = uVar8 + 1;
    } while (uVar8 != bVar1);
  }
  return;
}

Assistant:

void
fe_spec2cep(fe_t * fe, const powspec_t * mflogspec, mfcc_t * mfcep)
{
    int32 i, j, beta;

    /* Compute C0 separately (its basis vector is 1) to avoid
     * costly multiplications. */
    mfcep[0] = mflogspec[0] / 2;        /* beta = 0.5 */
    for (j = 1; j < fe->mel_fb->num_filters; j++)
        mfcep[0] += mflogspec[j];       /* beta = 1.0 */
    mfcep[0] /= (frame_t) fe->mel_fb->num_filters;

    for (i = 1; i < fe->num_cepstra; ++i) {
        mfcep[i] = 0;
        for (j = 0; j < fe->mel_fb->num_filters; j++) {
            if (j == 0)
                beta = 1;       /* 0.5 */
            else
                beta = 2;       /* 1.0 */
            mfcep[i] += COSMUL(mflogspec[j],
                               fe->mel_fb->mel_cosine[i][j]) * beta;
        }
        /* Note that this actually normalizes by num_filters, like the
         * original Sphinx front-end, due to the doubled 'beta' factor
         * above.  */
        mfcep[i] /= (frame_t) fe->mel_fb->num_filters * 2;
    }
}